

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O0

void icu_63::checkAlias(char *itemName,Resource res,UChar *alias,int32_t length,UBool useResSuffix,
                       CheckDependency *check,void *context,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UResType UVar2;
  char *suffix;
  bool bVar3;
  char local_58 [8];
  char localeID [32];
  int32_t i;
  CheckDependency *check_local;
  UBool useResSuffix_local;
  int32_t length_local;
  UChar *alias_local;
  Resource res_local;
  char *itemName_local;
  
  UVar1 = uprv_isInvariantUString_63(alias,length);
  if (UVar1 == '\0') {
    fprintf(_stderr,
            "icupkg/ures_enumDependencies(%s res=%08x) alias string contains non-invariant characters\n"
            ,itemName,(ulong)res);
    *pErrorCode = U_INVALID_CHAR_FOUND;
  }
  else {
    localeID[0x1c] = '\0';
    localeID[0x1d] = '\0';
    localeID[0x1e] = '\0';
    localeID[0x1f] = '\0';
    while( true ) {
      bVar3 = false;
      if ((int)localeID._28_4_ < length) {
        bVar3 = alias[(int)localeID._28_4_] != L'/';
      }
      if (!bVar3) break;
      localeID._28_4_ = localeID._28_4_ + 1;
    }
    UVar2 = res_getPublicType_63(res);
    if (UVar2 == RES_ALIAS) {
      if (localeID._28_4_ == 0) {
        return;
      }
      check_local._4_1_ = localeID[0x1c];
      check_local._5_1_ = localeID[0x1d];
      check_local._6_1_ = localeID[0x1e];
      check_local._7_1_ = localeID[0x1f];
    }
    else {
      check_local._4_4_ = length;
      if (localeID._28_4_ != length) {
        fprintf(_stderr,"icupkg/ures_enumDependencies(%s res=%08x) %%ALIAS contains a \'/\'\n",
                itemName,(ulong)res);
        *pErrorCode = U_UNSUPPORTED_ERROR;
        return;
      }
    }
    if (check_local._4_4_ < 0x20) {
      u_UCharsToChars_63(alias,local_58,check_local._4_4_);
      local_58[check_local._4_4_] = '\0';
      suffix = "";
      if (useResSuffix != '\0') {
        suffix = ".res";
      }
      checkIDSuffix(itemName,local_58,-1,suffix,check,context,pErrorCode);
    }
    else {
      fprintf(_stderr,
              "icupkg/ures_enumDependencies(%s res=%08x) alias locale ID length %ld too long\n",
              itemName,(ulong)res,(long)check_local._4_4_);
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
    }
  }
  return;
}

Assistant:

static void
checkAlias(const char *itemName,
           Resource res, const UChar *alias, int32_t length, UBool useResSuffix,
           CheckDependency check, void *context, UErrorCode *pErrorCode) {
    int32_t i;

    if(!uprv_isInvariantUString(alias, length)) {
        fprintf(stderr, "icupkg/ures_enumDependencies(%s res=%08x) alias string contains non-invariant characters\n",
                        itemName, res);
        *pErrorCode=U_INVALID_CHAR_FOUND;
        return;
    }

    // extract the locale ID from alias strings like
    // locale_ID/key1/key2/key3
    // locale_ID

    // search for the first slash
    for(i=0; i<length && alias[i]!=SLASH; ++i) {}

    if(res_getPublicType(res)==URES_ALIAS) {
        // ignore aliases with an initial slash:
        // /ICUDATA/... and /pkgname/... go to a different package
        // /LOCALE/... are for dynamic sideways fallbacks and don't go to a fixed bundle
        if(i==0) {
            return; // initial slash ('/')
        }

        // ignore the intra-bundle path starting from the first slash ('/')
        length=i;
    } else /* URES_STRING */ {
        // the whole string should only consist of a locale ID
        if(i!=length) {
            fprintf(stderr, "icupkg/ures_enumDependencies(%s res=%08x) %%ALIAS contains a '/'\n",
                            itemName, res);
            *pErrorCode=U_UNSUPPORTED_ERROR;
            return;
        }
    }

    // convert the Unicode string to char *
    char localeID[32];
    if(length>=(int32_t)sizeof(localeID)) {
        fprintf(stderr, "icupkg/ures_enumDependencies(%s res=%08x) alias locale ID length %ld too long\n",
                        itemName, res, (long)length);
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        return;
    }
    u_UCharsToChars(alias, localeID, length);
    localeID[length]=0;

    checkIDSuffix(itemName, localeID, -1, (useResSuffix ? ".res" : ""), check, context, pErrorCode);
}